

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O3

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>
          (LAKBO *this,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t0,
          Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *t1)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  _ElementType_conflict as;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:121:59),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  i;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:121:59),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  i_00;
  Result RVar3;
  _ElementType_conflict as_1;
  size_t in_stack_ffffffffffffff60;
  __mpz_struct *in_stack_ffffffffffffff68;
  __mpz_struct *in_stack_ffffffffffffff70;
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::IntegerConstantType>
  *in_stack_ffffffffffffff78;
  unsigned_long in_stack_ffffffffffffff80;
  __mpz_struct *local_78;
  __mpz_struct *local_70;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_60;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_40;
  
  pMVar1 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)(t0->_summands)._stack;
  if (((int)((ulong)((long)(t0->_summands)._cursor - (long)pMVar1) >> 4) * -0x55555555 == 1) &&
     (pMVar2 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)(t1->_summands)._stack,
     (int)((ulong)((long)(t1->_summands)._cursor - (long)pMVar2) >> 4) * -0x55555555 == 1)) {
    as.t1 = pMVar2;
    as.t0 = pMVar1;
    as.this = this;
    as_1.t1 = pMVar2;
    as_1.t0 = pMVar1;
    RVar3 = AlascaOrderingUtils::
            lexLazy<Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&)const::_lambda()_1_,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&)const::_lambda()_2_>
                      (as,as_1);
  }
  else {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
              (&local_40,&t0->_summands);
    i._iter._inner._func.a =
         (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
         in_stack_ffffffffffffff68;
    i._iter._0_8_ = in_stack_ffffffffffffff60;
    i._iter._inner._inner._next = (unsigned_long)in_stack_ffffffffffffff70;
    i._iter._inner._inner._from = (unsigned_long)in_stack_ffffffffffffff78;
    i._iter._inner._inner._to = in_stack_ffffffffffffff80;
    MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>::operator()(i);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
              (&local_60,&t1->_summands);
    i_00._iter._inner._func.a =
         (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
         in_stack_ffffffffffffff68;
    i_00._iter._0_8_ = in_stack_ffffffffffffff60;
    i_00._iter._inner._inner._next = (unsigned_long)in_stack_ffffffffffffff70;
    i_00._iter._inner._inner._from = (unsigned_long)in_stack_ffffffffffffff78;
    i_00._iter._inner._inner._to = in_stack_ffffffffffffff80;
    MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>::operator()(i_00);
    RVar3 = OrderingUtils::
            mulExt<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>const&)const::_lambda(auto:1&,auto:2&)_1_>
                      ((MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       &stack0xffffffffffffff80,
                       (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       &stack0xffffffffffffff60,(anon_class_8_1_8991fb9c)this);
    while (in_stack_ffffffffffffff70 != in_stack_ffffffffffffff68) {
      mpz_clear(in_stack_ffffffffffffff70 + -2);
      mpz_clear(in_stack_ffffffffffffff70 + -3);
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + -4;
      mpz_clear(in_stack_ffffffffffffff70);
    }
    if (in_stack_ffffffffffffff70 != (__mpz_struct *)0x0) {
      if (in_stack_ffffffffffffff60 << 6 == 0) {
        in_stack_ffffffffffffff68->_mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        in_stack_ffffffffffffff68->_mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = in_stack_ffffffffffffff68;
      }
      else if (in_stack_ffffffffffffff60 << 6 < 0x41) {
        in_stack_ffffffffffffff68->_mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        in_stack_ffffffffffffff68->_mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = in_stack_ffffffffffffff68;
      }
      else {
        operator_delete(in_stack_ffffffffffffff68,0x10);
      }
    }
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_60);
    while (local_70 != local_78) {
      mpz_clear(local_70 + -2);
      mpz_clear(local_70 + -3);
      local_70 = local_70 + -4;
      mpz_clear(local_70);
    }
    if (local_70 != (__mpz_struct *)0x0) {
      if (in_stack_ffffffffffffff80 << 6 == 0) {
        local_78->_mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        local_78->_mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78;
      }
      else if (in_stack_ffffffffffffff80 << 6 < 0x41) {
        local_78->_mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        local_78->_mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78;
      }
      else {
        operator_delete(local_78,0x10);
      }
    }
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_40);
  }
  return RVar3;
}

Assistant:

Ordering::Result cmpSameSkeleton(Polynom<NumTraits> const& t0, Polynom<NumTraits> const& t1) const 
  { 
    if (t0.nSummands() == 1 && t1.nSummands() == 1) {
      return cmpSameSkeleton(t0.summandAt(0), t1.summandAt(0));
    } else {
      auto set = [](auto p) { return p.iterSummands().map([](auto& x) { return x; }).template collect<MultiSet>(); };
      return OrderingUtils::mulExt(set(t0), set(t1), [&](auto& l, auto& r) { return compare(l, r); });
    }
  }